

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_output_op(MIR_context_t ctx,FILE *f,MIR_op_t op,MIR_func_t func)

{
  MIR_insn_t pMVar1;
  float var;
  MIR_alias_t alias;
  undefined4 uVar2;
  char *pcVar3;
  MIR_label_t label;
  undefined4 uVar4;
  code *pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  MIR_reg_t MVar8;
  undefined8 uStack_60;
  
  var = op.u._0_4_;
  label = op.u._0_8_;
  switch(op._8_1_) {
  case (BADTYPE)0x1:
    output_reg(ctx,f,func,(MIR_reg_t)var);
    return;
  case (BADTYPE)0x2:
    output_var(ctx,f,func,(MIR_reg_t)var);
    return;
  case (BADTYPE)0x3:
    pcVar3 = "%ld";
    break;
  case (BADTYPE)0x4:
    pcVar3 = "%lu";
    break;
  case (BADTYPE)0x5:
    label = (MIR_label_t)(double)var;
    pcVar3 = "%.*ef";
    uStack_60 = 0x18;
    goto LAB_00117c89;
  case (BADTYPE)0x6:
    pcVar3 = "%.*e";
    uStack_60 = 0x35;
LAB_00117c89:
    fprintf((FILE *)f,pcVar3,label,uStack_60);
    return;
  case (BADTYPE)0x7:
    fprintf((FILE *)f,"%.*LeL",0x40);
    return;
  case (BADTYPE)0x8:
    pMVar1 = (label->insn_link).prev;
    if (pMVar1 != (MIR_insn_t)func->func_item->module) {
      ctx = (MIR_context_t)f;
      fprintf((FILE *)f,"%s.",(pMVar1->insn_link).prev);
    }
    pcVar3 = MIR_item_name(ctx,(MIR_item_t_conflict)label);
    fputs(pcVar3,(FILE *)f);
    return;
  case (BADTYPE)0x9:
    MIR_output_str(ctx,f,op.u._0_16_);
    return;
  case (BADTYPE)0xa:
  case (BADTYPE)0xb:
    MVar8 = -(uint)(op._8_1_ != '\n');
    pcVar3 = MIR_type_str(ctx,(uint)(byte)op.u.reg._0_1_);
    fputs(pcVar3,(FILE *)f);
    fputc(0x3a,(FILE *)f);
    uVar2 = op.u.mem.index;
    uVar7 = op.u.mem.base;
    if ((op.u.mem.disp != 0) ||
       (uVar6 = op.u.mem.base, uVar2 = MVar8, uVar7 = MVar8, uVar4 = op.u.mem.index,
       op.u.mem.index == MVar8 && op.u.mem.base == MVar8)) {
      fprintf((FILE *)f,"%ld");
      uVar6 = uVar7;
      uVar4 = uVar2;
    }
    if (uVar4 != MVar8 || uVar6 != MVar8) {
      fputc(0x28,(FILE *)f);
      if (uVar6 != MVar8) {
        pcVar5 = output_var;
        if (op._8_1_ == '\n') {
          pcVar5 = output_reg;
        }
        (*pcVar5)(ctx,f,func,uVar6);
      }
      if (uVar4 != MVar8) {
        fwrite(", ",2,1,(FILE *)f);
        pcVar5 = output_var;
        if (op._8_1_ == '\n') {
          pcVar5 = output_reg;
        }
        (*pcVar5)(ctx,f,func,uVar4);
        if (op.u.mem.scale != 1) {
          fwrite(", ",2,1,(FILE *)f);
          fprintf((FILE *)f,"%u",(ulong)(uint)op.u.mem.scale);
        }
      }
      fputc(0x29,(FILE *)f);
    }
    alias = op.u._8_4_;
    if (op.u.mem.alias != 0 || alias != 0) {
      fputc(0x3a,(FILE *)f);
      if (op.u.mem.alias != 0) {
        pcVar3 = MIR_alias_name(ctx,op.u.mem.alias);
        fputs(pcVar3,(FILE *)f);
      }
      if (alias != 0) {
        label = (MIR_label_t)MIR_alias_name(ctx,alias);
        pcVar3 = ":%s";
        break;
      }
    }
    return;
  case (BADTYPE)0xc:
    output_label(ctx,f,func,label);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xb95,"void MIR_output_op(MIR_context_t, FILE *, MIR_op_t, MIR_func_t)");
  }
  fprintf((FILE *)f,pcVar3,label);
  return;
}

Assistant:

void MIR_output_op (MIR_context_t ctx, FILE *f, MIR_op_t op, MIR_func_t func) {
  switch (op.mode) {
  case MIR_OP_REG: output_reg (ctx, f, func, op.u.reg); break;
  case MIR_OP_VAR: output_var (ctx, f, func, op.u.var); break;
  case MIR_OP_INT: fprintf (f, "%" PRId64, op.u.i); break;
  case MIR_OP_UINT: fprintf (f, "%" PRIu64, op.u.u); break;
  case MIR_OP_FLOAT: fprintf (f, "%.*ef", FLT_MANT_DIG, op.u.f); break;
  case MIR_OP_DOUBLE: fprintf (f, "%.*e", DBL_MANT_DIG, op.u.d); break;
  case MIR_OP_LDOUBLE: fprintf (f, "%.*LeL", LDBL_MANT_DIG, op.u.ld); break;
  case MIR_OP_MEM:
  case MIR_OP_VAR_MEM: {
    MIR_reg_t no_reg = op.mode == MIR_OP_MEM ? 0 : MIR_NON_VAR;

    output_type (ctx, f, op.u.mem.type);
    fprintf (f, ":");
    if (op.u.mem.disp != 0 || (op.u.mem.base == no_reg && op.u.mem.index == no_reg))
      output_disp (f, op.u.mem.disp);
    if (op.u.mem.base != no_reg || op.u.mem.index != no_reg) {
      fprintf (f, "(");
      if (op.u.mem.base != no_reg)
        (op.mode == MIR_OP_MEM ? output_reg : output_var) (ctx, f, func, op.u.mem.base);
      if (op.u.mem.index != no_reg) {
        fprintf (f, ", ");
        (op.mode == MIR_OP_MEM ? output_reg : output_var) (ctx, f, func, op.u.mem.index);
        if (op.u.mem.scale != 1) {
          fprintf (f, ", ");
          output_scale (f, op.u.mem.scale);
        }
      }
      fprintf (f, ")");
    }
    if (op.u.mem.alias != 0 || op.u.mem.nonalias != 0) {
      fprintf (f, ":");
      if (op.u.mem.alias != 0) fprintf (f, "%s", MIR_alias_name (ctx, op.u.mem.alias));
      if (op.u.mem.nonalias != 0) fprintf (f, ":%s", MIR_alias_name (ctx, op.u.mem.nonalias));
    }
    break;
  }
  case MIR_OP_REF:
    if (op.u.ref->module != func->func_item->module) fprintf (f, "%s.", op.u.ref->module->name);
    fprintf (f, "%s", MIR_item_name (ctx, op.u.ref));
    break;
  case MIR_OP_STR: MIR_output_str (ctx, f, op.u.str); break;
  case MIR_OP_LABEL: output_label (ctx, f, func, op.u.label); break;
  default: mir_assert (FALSE);
  }
}